

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::Statement(SQCompiler *this,bool closeframe)

{
  long lVar1;
  SQFuncState *pSVar2;
  SQObjectValue this_00;
  SQOpcode SVar3;
  bool bVar4;
  SQInteger SVar5;
  SQUnsignedInteger SVar6;
  longlong *plVar7;
  SQInteger SVar8;
  SQObject SVar9;
  SQObjectPtr local_b0;
  undefined1 local_a0 [8];
  SQObjectPtr strongid;
  SQTable *enums;
  SQObject val;
  undefined1 local_68 [8];
  SQObject id;
  SQInteger oldouters;
  SQScope __oldscope__;
  SQInteger local_28;
  long local_20;
  SQInteger retexp;
  SQOpcode op;
  bool closeframe_local;
  SQCompiler *this_local;
  
  retexp._7_1_ = closeframe;
  _op = this;
  SQFuncState::AddLineInfos(this->_fs,(this->_lex)._currentline,(bool)(this->_lineinfo & 1),false);
  lVar1 = this->_token;
  if (lVar1 == 0x3b) {
    Lex(this);
  }
  else if (lVar1 == 0x7b) {
    SVar8 = (this->_scope).outers;
    __oldscope__.outers = (this->_scope).stacksize;
    (this->_scope).outers = this->_fs->_outers;
    SVar5 = SQFuncState::GetStackSize(this->_fs);
    (this->_scope).stacksize = SVar5;
    Lex(this);
    Statements(this);
    Expect(this,0x7d);
    if ((retexp._7_1_ & 1) == 0) {
      SVar5 = SQFuncState::GetStackSize(this->_fs);
      if (SVar5 != (this->_scope).stacksize) {
        SQFuncState::SetStackSize(this->_fs,(this->_scope).stacksize);
      }
      (this->_scope).outers = SVar8;
      (this->_scope).stacksize = __oldscope__.outers;
    }
    else {
      id._unVal = (SQObjectValue)this->_fs->_outers;
      SVar5 = SQFuncState::GetStackSize(this->_fs);
      if ((SVar5 != (this->_scope).stacksize) &&
         (SQFuncState::SetStackSize(this->_fs,(this->_scope).stacksize),
         id._unVal.pTable != (SQTable *)this->_fs->_outers)) {
        SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
      }
      (this->_scope).outers = SVar8;
      (this->_scope).stacksize = __oldscope__.outers;
    }
  }
  else if (lVar1 == 0x10c) {
    SwitchStatement(this);
  }
  else if (lVar1 == 0x110) {
    IfStatement(this);
  }
  else if (lVar1 == 0x112) {
    WhileStatement(this);
  }
  else if (lVar1 == 0x113) {
    SVar6 = sqvector<long_long>::size(&this->_fs->_breaktargets);
    if (SVar6 == 0) {
      Error(this,"\'break\' has to be in a loop block");
    }
    plVar7 = sqvector<long_long>::top(&this->_fs->_breaktargets);
    if (0 < *plVar7) {
      pSVar2 = this->_fs;
      plVar7 = sqvector<long_long>::top(&this->_fs->_breaktargets);
      SQFuncState::AddInstruction(pSVar2,_OP_POPTRAP,*plVar7,0,0,0);
    }
    SVar8 = SQFuncState::GetStackSize(this->_fs);
    if ((SVar8 != (this->_scope).stacksize) &&
       (SVar8 = SQFuncState::CountOuters(this->_fs,(this->_scope).stacksize), SVar8 != 0)) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
    SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,-0x4d2,0,0);
    pSVar2 = this->_fs;
    local_28 = SQFuncState::GetCurrentPos(this->_fs);
    sqvector<long_long>::push_back(&pSVar2->_unresolvedbreaks,&local_28);
    Lex(this);
  }
  else if (lVar1 == 0x114) {
    ForStatement(this);
  }
  else if (lVar1 == 0x115) {
    DoWhileStatement(this);
  }
  else if (lVar1 == 0x117) {
    ForEachStatement(this);
  }
  else if (lVar1 == 0x11b) {
    LocalDeclStatement(this);
  }
  else if (lVar1 == 0x11d) {
    FunctionStatement(this);
  }
  else {
    if (lVar1 != 0x11e) {
      if (lVar1 == 0x123) {
        SVar6 = sqvector<long_long>::size(&this->_fs->_continuetargets);
        if (SVar6 == 0) {
          Error(this,"\'continue\' has to be in a loop block");
        }
        plVar7 = sqvector<long_long>::top(&this->_fs->_continuetargets);
        if (0 < *plVar7) {
          pSVar2 = this->_fs;
          plVar7 = sqvector<long_long>::top(&this->_fs->_continuetargets);
          SQFuncState::AddInstruction(pSVar2,_OP_POPTRAP,*plVar7,0,0,0);
        }
        SVar8 = SQFuncState::GetStackSize(this->_fs);
        if ((SVar8 != (this->_scope).stacksize) &&
           (SVar8 = SQFuncState::CountOuters(this->_fs,(this->_scope).stacksize), SVar8 != 0)) {
          SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
        }
        SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,-0x4d2,0,0);
        pSVar2 = this->_fs;
        __oldscope__.stacksize = SQFuncState::GetCurrentPos(this->_fs);
        sqvector<long_long>::push_back(&pSVar2->_unresolvedcontinues,&__oldscope__.stacksize);
        Lex(this);
        goto LAB_001ac5c4;
      }
      if (lVar1 != 0x124) {
        if (lVar1 == 0x125) {
          TryCatchStatement(this);
        }
        else if (lVar1 == 0x127) {
          Lex(this);
          CommaExpr(this);
          pSVar2 = this->_fs;
          SVar8 = SQFuncState::PopTarget(this->_fs);
          SQFuncState::AddInstruction(pSVar2,_OP_THROW,SVar8,0,0,0);
        }
        else if (lVar1 == 0x133) {
          ClassStatement(this);
        }
        else if (lVar1 == 0x143) {
          EnumStatement(this);
        }
        else if (lVar1 == 0x144) {
          Lex(this);
          SVar9 = Expect(this,0x102);
          id._0_8_ = SVar9._unVal;
          local_68._0_4_ = SVar9._type;
          SVar9 = Expect(this,0x3d);
          val._unVal.fFloat = (SQFloat)SVar9._type;
          SVar9 = ExpectScalar(this);
          val._0_8_ = SVar9._unVal;
          enums._0_4_ = SVar9._type;
          OptionalSemicolon(this);
          strongid.super_SQObject._unVal = (this->_vm->_sharedstate->_consts).super_SQObject._unVal;
          ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_a0,(SQObject *)local_68);
          this_00 = strongid.super_SQObject._unVal;
          ::SQObjectPtr::SQObjectPtr(&local_b0,(SQObject *)&enums);
          SQTable::NewSlot(this_00.pTable,(SQObjectPtr *)local_a0,&local_b0);
          ::SQObjectPtr::~SQObjectPtr(&local_b0);
          ::SQObjectPtr::Null((SQObjectPtr *)local_a0);
          ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_a0);
        }
        else {
          CommaExpr(this);
          SQFuncState::DiscardTarget(this->_fs);
        }
        goto LAB_001ac5c4;
      }
    }
    if (this->_token == 0x11e) {
      retexp._0_4_ = _OP_RETURN;
    }
    else {
      retexp._0_4_ = _OP_YIELD;
      this->_fs->_bgenerator = true;
    }
    Lex(this);
    bVar4 = IsEndOfStatement(this);
    if (bVar4) {
      if (((SQOpcode)retexp == _OP_RETURN) && (0 < this->_fs->_traps)) {
        SQFuncState::AddInstruction(this->_fs,_OP_POPTRAP,this->_fs->_traps,0,0,0);
      }
      SVar3 = (SQOpcode)retexp;
      this->_fs->_returnexp = -1;
      pSVar2 = this->_fs;
      SVar8 = SQFuncState::GetStackSize(this->_fs);
      SQFuncState::AddInstruction(pSVar2,SVar3,0xff,0,SVar8,0);
    }
    else {
      SVar8 = SQFuncState::GetCurrentPos(this->_fs);
      local_20 = SVar8 + 1;
      CommaExpr(this);
      if (((SQOpcode)retexp == _OP_RETURN) && (0 < this->_fs->_traps)) {
        SQFuncState::AddInstruction(this->_fs,_OP_POPTRAP,this->_fs->_traps,0,0,0);
      }
      SVar3 = (SQOpcode)retexp;
      this->_fs->_returnexp = local_20;
      pSVar2 = this->_fs;
      SVar8 = SQFuncState::PopTarget(this->_fs);
      SVar5 = SQFuncState::GetStackSize(this->_fs);
      SQFuncState::AddInstruction(pSVar2,SVar3,1,SVar8,SVar5,0);
    }
  }
LAB_001ac5c4:
  SQFuncState::SnoozeOpt(this->_fs);
  return;
}

Assistant:

void Statement(bool closeframe = true)
    {
        _fs->AddLineInfos(_lex._currentline, _lineinfo);
        switch(_token){
        case _SC(';'):  Lex();                  break;
        case TK_IF:     IfStatement();          break;
        case TK_WHILE:      WhileStatement();       break;
        case TK_DO:     DoWhileStatement();     break;
        case TK_FOR:        ForStatement();         break;
        case TK_FOREACH:    ForEachStatement();     break;
        case TK_SWITCH: SwitchStatement();      break;
        case TK_LOCAL:      LocalDeclStatement();   break;
        case TK_RETURN:
        case TK_YIELD: {
            SQOpcode op;
            if(_token == TK_RETURN) {
                op = _OP_RETURN;
            }
            else {
                op = _OP_YIELD;
                _fs->_bgenerator = true;
            }
            Lex();
            if(!IsEndOfStatement()) {
                SQInteger retexp = _fs->GetCurrentPos()+1;
                CommaExpr();
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps, 0);
                _fs->_returnexp = retexp;
                _fs->AddInstruction(op, 1, _fs->PopTarget(),_fs->GetStackSize());
            }
            else{
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps ,0);
                _fs->_returnexp = -1;
                _fs->AddInstruction(op, 0xFF,0,_fs->GetStackSize());
            }
            break;}
        case TK_BREAK:
            if(_fs->_breaktargets.size() <= 0)Error(_SC("'break' has to be in a loop block"));
            if(_fs->_breaktargets.top() > 0){
                _fs->AddInstruction(_OP_POPTRAP, _fs->_breaktargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedbreaks.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_CONTINUE:
            if(_fs->_continuetargets.size() <= 0)Error(_SC("'continue' has to be in a loop block"));
            if(_fs->_continuetargets.top() > 0) {
                _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_FUNCTION:
            FunctionStatement();
            break;
        case TK_CLASS:
            ClassStatement();
            break;
        case TK_ENUM:
            EnumStatement();
            break;
        case _SC('{'):{
                BEGIN_SCOPE();
                Lex();
                Statements();
                Expect(_SC('}'));
                if(closeframe) {
                    END_SCOPE();
                }
                else {
                    END_SCOPE_NO_CLOSE();
                }
            }
            break;
        case TK_TRY:
            TryCatchStatement();
            break;
        case TK_THROW:
            Lex();
            CommaExpr();
            _fs->AddInstruction(_OP_THROW, _fs->PopTarget());
            break;
        case TK_CONST:
            {
            Lex();
            SQObject id = Expect(TK_IDENTIFIER);
            Expect('=');
            SQObject val = ExpectScalar();
            OptionalSemicolon();
            SQTable *enums = _table(_ss(_vm)->_consts);
            SQObjectPtr strongid = id;
            enums->NewSlot(strongid,SQObjectPtr(val));
            strongid.Null();
            }
            break;
        default:
            CommaExpr();
            _fs->DiscardTarget();
            //_fs->PopTarget();
            break;
        }
        _fs->SnoozeOpt();
    }